

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::matroska_read_header(MatroskaDemuxer *this)

{
  int *levelUp;
  Track *pTVar1;
  MatroskaTrack *track;
  int iVar2;
  int iVar3;
  ParsedLPCMTrackData *this_00;
  size_t sVar4;
  undefined4 *puVar5;
  uint32_t uVar6;
  char *pcVar7;
  long lVar8;
  int version;
  char *doctype;
  int last_level;
  ostringstream ss;
  int local_208;
  uint32_t local_204;
  char *local_200;
  uint *local_1f8;
  undefined8 local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  uint *local_1d8;
  undefined8 local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  _func_int **local_1b8;
  int local_1ac;
  uint32_t local_1a8 [94];
  
  iVar2 = (this->super_IOContextDemuxer).num_tracks;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      pTVar1 = (this->super_IOContextDemuxer).tracks[lVar8];
      if (pTVar1 != (Track *)0x0) {
        operator_delete__(pTVar1);
        iVar2 = (this->super_IOContextDemuxer).num_tracks;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar2);
  }
  (this->super_IOContextDemuxer).num_tracks = 0;
  local_200 = (char *)0x0;
  iVar2 = ebml_read_header(this,&local_200,&local_208);
  if (iVar2 < 0) {
    return iVar2;
  }
  if ((local_200 == (char *)0x0) || (iVar2 = strcmp(local_200,"matroska"), iVar2 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Wrong EBML doctype (\'",0x15);
    pcVar7 = "(none)";
    if (local_200 != (char *)0x0) {
      pcVar7 = local_200;
    }
    sVar4 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\' != \'matroska\').",0x11);
    puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = 900;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    if (local_1d8 == &local_1c8) {
      puVar5[6] = local_1c8;
      puVar5[7] = uStack_1c4;
      puVar5[8] = uStack_1c0;
      puVar5[9] = uStack_1bc;
    }
    else {
      *(uint **)(puVar5 + 2) = local_1d8;
      *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1c4,local_1c8);
    }
    *(undefined8 *)(puVar5 + 4) = local_1d0;
    local_1d0 = 0;
    local_1c8 = local_1c8 & 0xffffff00;
    local_1d8 = &local_1c8;
    __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (2 < local_208) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Matroska demuxer version 2 too old for file version ",0x34);
    std::ostream::operator<<((ostream *)local_1a8,local_208);
    puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = 900;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    if (local_1f8 == &local_1e8) {
      puVar5[6] = local_1e8;
      puVar5[7] = uStack_1e4;
      puVar5[8] = uStack_1e0;
      puVar5[9] = uStack_1dc;
    }
    else {
      *(uint **)(puVar5 + 2) = local_1f8;
      *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1e4,local_1e8);
    }
    *(undefined8 *)(puVar5 + 4) = local_1f0;
    local_1f0 = 0;
    local_1e8 = local_1e8 & 0xffffff00;
    local_1f8 = &local_1e8;
    __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  while( true ) {
    iVar2 = ebml_read_element_id(this,local_1a8,&local_1ac);
    uVar6 = 0;
    if (-1 < iVar2) {
      uVar6 = local_1a8[0];
    }
    if (uVar6 == 0) {
      return -1;
    }
    if (uVar6 == 0x18538067) break;
    iVar2 = ebml_read_skip(this);
    if (iVar2 < 0) {
      return iVar2;
    }
  }
  iVar2 = ebml_read_master(this,&local_204);
  if (iVar2 < 0) {
    return iVar2;
  }
  this->segment_start = (this->super_IOContextDemuxer).m_processedBytes;
  this->time_scale = 1000000;
  levelUp = &this->level_up;
  iVar2 = 0;
  do {
    if (iVar2 != 0) goto LAB_0019c7d8;
    iVar3 = ebml_read_element_id(this,local_1a8,levelUp);
    iVar2 = -1;
    if ((iVar3 < 0) || (local_1a8[0] == 0)) goto LAB_0019c7d8;
    iVar3 = *levelUp;
    if (iVar3 != 0) {
      iVar2 = 0;
      break;
    }
    if ((int)local_1a8[0] < 0x1254c367) {
      if ((int)local_1a8[0] < 0x1043a770) goto LAB_0019c790;
      if (local_1a8[0] == 0x1043a770) {
        iVar2 = ebml_read_master(this,&local_204);
        if (-1 < iVar2) {
          iVar2 = matroska_parse_chapters(this);
        }
      }
      else {
        if (local_1a8[0] != 0x114d9b74) goto LAB_0019c790;
        ebml_read_skip(this);
        iVar2 = 0;
      }
LAB_0019c79a:
      iVar3 = *levelUp;
    }
    else {
      if ((int)local_1a8[0] < 0x1654ae6b) {
        if (local_1a8[0] == 0x1254c367) {
          if (this->metadata_parsed != false) goto LAB_0019c790;
          iVar2 = ebml_read_master(this,&local_204);
          if (-1 < iVar2) {
            iVar2 = matroska_parse_metadata(this);
          }
        }
        else if (local_1a8[0] == 0x1549a966) {
          iVar2 = ebml_read_master(this,&local_204);
          if (-1 < iVar2) {
            iVar2 = matroska_parse_info(this);
          }
        }
        else {
LAB_0019c790:
          iVar2 = ebml_read_skip(this);
        }
        goto LAB_0019c79a;
      }
      if (local_1a8[0] == 0x1654ae6b) {
        iVar2 = ebml_read_master(this,&local_204);
        if (-1 < iVar2) {
          iVar2 = matroska_parse_tracks(this);
        }
        goto LAB_0019c79a;
      }
      if (local_1a8[0] == 0x1c53bb6b) {
        if (this->index_parsed != false) goto LAB_0019c790;
        iVar2 = ebml_read_master(this,&local_204);
        if (-1 < iVar2) {
          iVar2 = matroska_parse_index(this);
        }
        goto LAB_0019c79a;
      }
      if (local_1a8[0] != 0x1f43b675) goto LAB_0019c790;
      iVar2 = 1;
      iVar3 = 0;
    }
  } while (iVar3 == 0);
  *levelUp = iVar3 + -1;
LAB_0019c7d8:
  iVar3 = ebml_read_element_id(this,local_1a8,(int *)0x0);
  if ((-1 < iVar3) && (local_1a8[0] == 0x1f43b675)) {
    if (0 < (this->super_IOContextDemuxer).num_tracks) {
      lVar8 = 0;
      local_1b8 = (_func_int **)&PTR__ParsedTrackPrivData_0023e178;
      do {
        track = (this->super_IOContextDemuxer).tracks[lVar8];
        track->stream_index = -1;
        pcVar7 = track->codec_id;
        if (pcVar7 != (char *)0x0) {
          iVar2 = this->num_streams;
          this->num_streams = iVar2 + 1;
          track->stream_index = iVar2;
          iVar2 = strcmp(pcVar7,"V_MPEG4/ISO/AVC");
          if ((iVar2 == 0) && (track->codec_priv != (uchar *)0x0)) {
            this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
            ParsedH264TrackData::ParsedH264TrackData
                      ((ParsedH264TrackData *)this_00,track->codec_priv,track->codec_priv_size);
          }
          else {
            iVar2 = strcmp(pcVar7,"V_MPEGH/ISO/HEVC");
            if ((iVar2 == 0) && (track->codec_priv != (uchar *)0x0)) {
              this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
              ParsedH265TrackData::ParsedH265TrackData
                        ((ParsedH265TrackData *)this_00,track->codec_priv,track->codec_priv_size);
            }
            else {
              iVar2 = strcmp(pcVar7,"V_MPEGI/ISO/VVC");
              if ((iVar2 == 0) && (track->codec_priv != (uchar *)0x0)) {
                this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
                ParsedH266TrackData::ParsedH266TrackData
                          ((ParsedH266TrackData *)this_00,track->codec_priv,track->codec_priv_size);
              }
              else {
                iVar2 = strcmp(pcVar7,"V_MS/VFW/FOURCC");
                if ((iVar2 == 0) && (track->codec_priv != (uchar *)0x0)) {
                  this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
                  ParsedVC1TrackData::ParsedVC1TrackData
                            ((ParsedVC1TrackData *)this_00,track->codec_priv,track->codec_priv_size)
                  ;
                }
                else {
                  iVar2 = strcmp(pcVar7,"A_AC3");
                  if (iVar2 == 0) {
                    this_00 = (ParsedLPCMTrackData *)operator_new(0x10);
                    ParsedAC3TrackData::ParsedAC3TrackData
                              ((ParsedAC3TrackData *)this_00,track->codec_priv,
                               track->codec_priv_size);
                  }
                  else {
                    iVar2 = strcmp(pcVar7,"A_AAC");
                    if (iVar2 == 0) {
                      this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
                      ParsedAACTrackData::ParsedAACTrackData
                                ((ParsedAACTrackData *)this_00,track->codec_priv,
                                 track->codec_priv_size);
                    }
                    else {
                      iVar2 = strcmp(pcVar7,"A_PCM/INT/BIG");
                      if (((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"A_PCM/INT/LIT"), iVar2 == 0)) ||
                         (iVar2 = strcmp(pcVar7,"A_MS/ACM"), iVar2 == 0)) {
                        this_00 = (ParsedLPCMTrackData *)operator_new(0x30);
                        ParsedLPCMTrackData::ParsedLPCMTrackData(this_00,track);
                      }
                      else {
                        iVar2 = strcmp(pcVar7,"S_TEXT/UTF8");
                        if (iVar2 == 0) {
                          this_00 = (ParsedLPCMTrackData *)operator_new(0x10);
                          ParsedSRTTrackData::ParsedSRTTrackData
                                    ((ParsedSRTTrackData *)this_00,track->codec_priv,
                                     track->codec_priv_size);
                        }
                        else {
                          iVar2 = strcmp(pcVar7,"S_HDMV/PGS");
                          if (iVar2 != 0) goto LAB_0019ca68;
                          this_00 = (ParsedLPCMTrackData *)operator_new(8);
                          (this_00->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData = local_1b8
                          ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          track->parsed_priv_data = &this_00->super_ParsedTrackPrivData;
        }
LAB_0019ca68:
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_IOContextDemuxer).num_tracks);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int MatroskaDemuxer::matroska_read_header()
{
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
    num_tracks = 0;

    // MatroskaDemuxContext *matroska = s->priv_data;
    char *doctype = nullptr;
    int version, last_level, res;
    uint32_t id;

    // matroska->ctx = s;

    /* First read the EBML header. */
    if ((res = ebml_read_header(&doctype, &version)) < 0)
        return res;
    if ((doctype == nullptr) || strcmp(doctype, "matroska") != 0)
    {
        THROW(ERR_MATROSKA_PARSE, "Wrong EBML doctype ('" << (doctype ? doctype : "(none)") << "' != 'matroska').")
    }
    if (version > 2)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska demuxer version 2 too old for file version " << version)
    }

    /* The next thing is a segment. */
    while (true)
    {
        if ((id = ebml_peek_id(&last_level)) == 0)
            return -BufferedReader::DATA_EOF;
        if (id == MATROSKA_ID_SEGMENT)
            break;
        if ((res = ebml_read_skip()) < 0)
            return res;
    }

    /* We now have a Matroska segment.
     * Seeks are from the beginning of the segment,
     * after the segment ID/length. */
    if ((res = ebml_read_master(&id)) < 0)
        return res;
    segment_start = m_processedBytes;

    time_scale = 1000000;
    /* we've found our segment, start reading the different contents in here */
    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* stream info */
        case MATROSKA_ID_INFO:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_info();
            break;
        }

        /* track info headers */
        case MATROSKA_ID_TRACKS:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_tracks();
            break;
        }

        case MATROSKA_ID_CHAPTERS:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_chapters();
            break;

        /* stream index */
        case MATROSKA_ID_CUES:
        {
            if (!index_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_index();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* metadata */
        case MATROSKA_ID_TAGS:
        {
            if (!metadata_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_metadata();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* file index (if seekable, seek to Cues/Tags to parse it) */
        case MATROSKA_ID_SEEKHEAD:
        {
            ebml_read_skip();
            break;
        }

        case MATROSKA_ID_CLUSTER:
        {
            /* Do not read the master - this will be done in the next
             * call to matroska_read_packet. */
            res = 1;
            break;
        }

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;

        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown matroska file header ID " << id);
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    /* Have we found a cluster? */
    if (ebml_peek_id(nullptr) == MATROSKA_ID_CLUSTER)
    {
        for (int i = 0; i < num_tracks; i++)
        {
            MatroskaTrack *track = tracks[i];
            track->stream_index = -1;
            if (track->codec_id == nullptr)
                continue;

            track->stream_index = num_streams++;

            if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH264TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_HEVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH265TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH266TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VIDEO_VFW_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedVC1TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AC3))
            {
                track->parsed_priv_data = new ParsedAC3TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AAC))
            {
                track->parsed_priv_data = new ParsedAACTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_BIG) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_LIT) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_ACM))
            {
                track->parsed_priv_data = new ParsedLPCMTrackData(track);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SRT))
            {
                track->parsed_priv_data = new ParsedSRTTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SUBTITLE_PGS))
            {
                track->parsed_priv_data = new ParsedPGTrackData();
            }
        }
        res = 0;
    }

    return res;
}